

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::blitTo
          (GLFrameBuffer *this,FrameBuffer *targetIn)

{
  PFNGLBINDFRAMEBUFFERPROC p_Var1;
  PFNGLBLITFRAMEBUFFERPROC p_Var2;
  FrameBufferHandle FVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long in_RSI;
  FrameBuffer *in_RDI;
  GLFrameBuffer *target;
  GLFrameBuffer *local_68;
  string *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [32];
  GLFrameBuffer *local_18;
  undefined1 fatal;
  
  if (in_RSI == 0) {
    local_68 = (GLFrameBuffer *)0x0;
  }
  else {
    local_68 = (GLFrameBuffer *)__dynamic_cast(in_RSI,&FrameBuffer::typeinfo,&typeinfo,0);
  }
  fatal = (undefined1)((ulong)in_RSI >> 0x38);
  local_18 = local_68;
  if (local_68 == (GLFrameBuffer *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"tried to blitTo() non-GL framebuffer",&local_39);
    exception(in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  (*in_RDI->_vptr_FrameBuffer[3])();
  p_Var1 = glad_glBindFramebuffer;
  FVar3 = getHandle(local_18);
  (*p_Var1)(0x8ca9,FVar3);
  p_Var2 = glad_glBlitFramebuffer;
  uVar4 = FrameBuffer::getSizeX(in_RDI);
  uVar5 = FrameBuffer::getSizeY(in_RDI);
  uVar6 = FrameBuffer::getSizeX(&local_18->super_FrameBuffer);
  uVar7 = FrameBuffer::getSizeY(&local_18->super_FrameBuffer);
  (*p_Var2)(0,0,uVar4,uVar5,0,0,uVar6,uVar7,0x4000,0x2601);
  checkGLError((bool)fatal);
  return;
}

Assistant:

void GLFrameBuffer::blitTo(FrameBuffer* targetIn) {

  // it _better_ be a GL buffer
  GLFrameBuffer* target = dynamic_cast<GLFrameBuffer*>(targetIn);
  if (!target) exception("tried to blitTo() non-GL framebuffer");

  // target->bindForRendering();
  bindForRendering();
  glBindFramebuffer(GL_DRAW_FRAMEBUFFER, target->getHandle());

  glBlitFramebuffer(0, 0, getSizeX(), getSizeY(), 0, 0, target->getSizeX(), target->getSizeY(), GL_COLOR_BUFFER_BIT,
                    GL_LINEAR);
  checkGLError();
}